

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int EncodeImageNoHuffman
              (VP8LBitWriter *bw,uint32_t *argb,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_array,int width,int height,int quality,int low_effort,
              WebPPicture *pic,int percent_range,int *percent)

{
  int iVar1;
  int iVar2;
  VP8LHashChain *hash_chain_00;
  HuffmanTreeCode *huffman_codes_00;
  void *pvVar3;
  VP8LBackwardRefs *in_RCX;
  VP8LHistogram *in_RDX;
  int iVar4;
  WebPPicture *in_stack_00000018;
  int in_stack_00000020;
  VP8LBitWriter *in_stack_00000028;
  HuffmanTreeCode *codes_1;
  HuffmanTreeCode *codes;
  HuffmanTree *huff_tree;
  VP8LHistogramSet *histogram_image;
  int cache_bits;
  uint32_t histogram_symbols [1];
  HuffmanTreeCode huffman_codes [5];
  HuffmanTreeToken *tokens;
  VP8LBackwardRefs *refs;
  int max_tokens;
  int i;
  WebPPicture *pWVar5;
  uint32_t bits;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffeb4;
  uint64_t in_stack_fffffffffffffeb8;
  HuffmanTreeCode *huffman_code;
  undefined4 in_stack_fffffffffffffedc;
  VP8LBitWriter *bw_00;
  int in_stack_fffffffffffffee8;
  int in_stack_ffffffffffffff00;
  HuffmanTreeCode *huffman_code_00;
  int in_stack_ffffffffffffff08;
  VP8LBackwardRefs *refs_00;
  int iVar7;
  undefined4 in_stack_ffffffffffffff24;
  WebPPicture *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint32_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  VP8LHashChain *in_stack_ffffffffffffff58;
  WebPPicture *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  int local_50;
  int local_4c;
  
  local_50 = 0;
  memset(&stack0xffffffffffffff28,0,0x78);
  memset(&stack0xffffffffffffff24,0,4);
  iVar7 = 0;
  refs_00 = (VP8LBackwardRefs *)0x0;
  hash_chain_00 =
       (VP8LHashChain *)
       WebPSafeMalloc(in_stack_fffffffffffffeb8,
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  if (hash_chain_00 == (VP8LHashChain *)0x0) {
    WebPEncodingSetError(in_stack_00000018,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    pWVar5 = in_stack_00000018;
    iVar1 = VP8LHashChainFill(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                              in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                              in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                              in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                              in_stack_ffffffffffffff80);
    if (iVar1 != 0) {
      iVar4 = in_stack_00000020 - in_stack_00000020 / 2;
      huffman_code = (HuffmanTreeCode *)&stack0xffffffffffffff20;
      bits = (uint32_t)((ulong)pWVar5 >> 0x20);
      uVar6 = 0;
      pWVar5 = in_stack_00000018;
      iVar1 = iVar7;
      iVar2 = VP8LGetBackwardReferences
                        (in_stack_fffffffffffffee8,(int)((ulong)in_stack_00000028 >> 0x20),
                         (uint32_t *)CONCAT44(in_stack_fffffffffffffedc,iVar4),
                         (int)((ulong)in_stack_00000018 >> 0x20),(int)in_stack_00000018,
                         (int)((ulong)huffman_code >> 0x20),in_stack_ffffffffffffff00,
                         in_stack_ffffffffffffff08,hash_chain_00,refs_00,
                         (int *)CONCAT44(in_stack_ffffffffffffff24,iVar7),in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff30,
                         (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (iVar2 != 0) {
        huffman_codes_00 =
             (HuffmanTreeCode *)
             VP8LAllocateHistogramSet((int)((ulong)huffman_code >> 0x20),(int)huffman_code);
        if (huffman_codes_00 == (HuffmanTreeCode *)0x0) {
          WebPEncodingSetError(in_stack_00000018,VP8_ENC_ERROR_OUT_OF_MEMORY);
        }
        else {
          VP8LHistogramSetClear((VP8LHistogramSet *)in_RCX);
          VP8LHistogramStoreRefs(in_RCX,in_RDX);
          iVar2 = GetHuffBitLengthsAndCodes
                            ((VP8LHistogramSet *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (HuffmanTreeCode *)in_stack_ffffffffffffff28);
          if (iVar2 == 0) {
            WebPEncodingSetError(in_stack_00000018,VP8_ENC_ERROR_OUT_OF_MEMORY);
          }
          else {
            VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffeb4,uVar6),bits,iVar1);
            for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
              if (local_50 < *(int *)(&stack0xffffffffffffff28 + (long)local_4c * 0x18)) {
                local_50 = *(int *)(&stack0xffffffffffffff28 + (long)local_4c * 0x18);
              }
            }
            pvVar3 = WebPSafeMalloc((uint64_t)in_RDX,CONCAT44(in_stack_fffffffffffffeb4,uVar6));
            if (pvVar3 == (void *)0x0) {
              WebPEncodingSetError(in_stack_00000018,VP8_ENC_ERROR_OUT_OF_MEMORY);
            }
            else {
              bw_00 = in_stack_00000028;
              for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
                huffman_code_00 =
                     (HuffmanTreeCode *)(&stack0xffffffffffffff28 + (long)local_4c * 0x18);
                StoreHuffmanCode(bw_00,(HuffmanTree *)CONCAT44(in_stack_fffffffffffffedc,iVar4),
                                 (HuffmanTreeToken *)pWVar5,huffman_code);
                ClearHuffmanTreeIfOnlyOneSymbol(huffman_code_00);
              }
              StoreImageToBitMask((VP8LBitWriter *)
                                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                                  (VP8LBackwardRefs *)in_stack_ffffffffffffff28,
                                  (uint32_t *)CONCAT44(in_stack_ffffffffffffff24,iVar7),
                                  huffman_codes_00,
                                  (WebPPicture *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            }
          }
        }
      }
    }
  }
  WebPSafeFree((void *)0x1862a9);
  WebPSafeFree((void *)0x1862b3);
  VP8LFreeHistogramSet((VP8LHistogramSet *)0x1862bd);
  WebPSafeFree((void *)0x1862ca);
  return (int)(in_stack_00000018->error_code == VP8_ENC_OK);
}

Assistant:

static int EncodeImageNoHuffman(VP8LBitWriter* const bw,
                                const uint32_t* const argb,
                                VP8LHashChain* const hash_chain,
                                VP8LBackwardRefs* const refs_array, int width,
                                int height, int quality, int low_effort,
                                const WebPPicture* const pic, int percent_range,
                                int* const percent) {
  int i;
  int max_tokens = 0;
  VP8LBackwardRefs* refs;
  HuffmanTreeToken* tokens = NULL;
  HuffmanTreeCode huffman_codes[5] = {{0, NULL, NULL}};
  const uint32_t histogram_symbols[1] = {0};  // only one tree, one symbol
  int cache_bits = 0;
  VP8LHistogramSet* histogram_image = NULL;
  HuffmanTree* const huff_tree = (HuffmanTree*)WebPSafeMalloc(
      3ULL * CODE_LENGTH_CODES, sizeof(*huff_tree));
  if (huff_tree == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Calculate backward references from ARGB image.
  if (!VP8LHashChainFill(hash_chain, quality, argb, width, height, low_effort,
                         pic, percent_range / 2, percent)) {
    goto Error;
  }
  if (!VP8LGetBackwardReferences(width, height, argb, quality, /*low_effort=*/0,
                                 kLZ77Standard | kLZ77RLE, cache_bits,
                                 /*do_no_cache=*/0, hash_chain, refs_array,
                                 &cache_bits, pic,
                                 percent_range - percent_range / 2, percent)) {
    goto Error;
  }
  refs = &refs_array[0];
  histogram_image = VP8LAllocateHistogramSet(1, cache_bits);
  if (histogram_image == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }
  VP8LHistogramSetClear(histogram_image);

  // Build histogram image and symbols from backward references.
  VP8LHistogramStoreRefs(refs, histogram_image->histograms[0]);

  // Create Huffman bit lengths and codes for each histogram image.
  assert(histogram_image->size == 1);
  if (!GetHuffBitLengthsAndCodes(histogram_image, huffman_codes)) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // No color cache, no Huffman image.
  VP8LPutBits(bw, 0, 1);

  // Find maximum number of symbols for the huffman tree-set.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    if (max_tokens < codes->num_symbols) {
      max_tokens = codes->num_symbols;
    }
  }

  tokens = (HuffmanTreeToken*)WebPSafeMalloc(max_tokens, sizeof(*tokens));
  if (tokens == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Store Huffman codes.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    StoreHuffmanCode(bw, huff_tree, tokens, codes);
    ClearHuffmanTreeIfOnlyOneSymbol(codes);
  }

  // Store actual literals.
  if (!StoreImageToBitMask(bw, width, 0, refs, histogram_symbols, huffman_codes,
                           pic)) {
    goto Error;
  }

 Error:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(histogram_image);
  WebPSafeFree(huffman_codes[0].codes);
  return (pic->error_code == VP8_ENC_OK);
}